

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::GetStateBlock
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *mD)

{
  element_type *peVar1;
  double *pdVar2;
  Index index;
  ulong uVar3;
  ulong uVar4;
  
  if (2 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar3 = 3;
    if ((((ulong)pdVar2 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar3 = uVar4;
    }
    peVar1 = (((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x20);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (uVar3 < 3) {
      do {
        pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x20);
        uVar3 = uVar3 + 1;
      } while (uVar3 != 3);
    }
    if (5 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3;
      uVar3 = 3;
      if ((((ulong)pdVar2 & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
        uVar3 = uVar4;
      }
      peVar1 = (((this->m_nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0xf0);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar3 < 3) {
        do {
          pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0xf0);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      if (8 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 6;
        uVar3 = 3;
        if ((((ulong)pdVar2 & 7) == 0) &&
           (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
          uVar3 = uVar4;
        }
        peVar1 = (((this->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x140);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        if (uVar3 < 3) {
          do {
            pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x140);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        if (0xb < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
          pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + 9;
          uVar3 = 3;
          if ((((ulong)pdVar2 & 7) == 0) &&
             (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
            uVar3 = uVar4;
          }
          peVar1 = (((this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (uVar3 != 0) {
            uVar4 = 0;
            do {
              pdVar2[uVar4] = *(double *)((long)&peVar1->DDD_dt + uVar4 * 8 + 0xffffffffffffffe8);
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          if (uVar3 < 3) {
            do {
              pdVar2[uVar3] = *(double *)((long)&peVar1->DDD_dt + uVar3 * 8 + 0xffffffffffffffe8);
              uVar3 = uVar3 + 1;
            } while (uVar3 != 3);
          }
          if (0xe < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) {
            pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data + 0xc;
            uVar3 = 3;
            if ((((ulong)pdVar2 & 7) == 0) &&
               (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
              uVar3 = uVar4;
            }
            peVar1 = (this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (uVar3 != 0) {
              uVar4 = 0;
              do {
                pdVar2[uVar4] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x20);
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
            }
            if (uVar3 < 3) {
              do {
                pdVar2[uVar3] = *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x20);
                uVar3 = uVar3 + 1;
              } while (uVar3 != 3);
            }
            if (0x11 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows) {
              pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + 0xf;
              uVar3 = 3;
              if ((((ulong)pdVar2 & 7) == 0) &&
                 (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
                uVar3 = uVar4;
              }
              peVar1 = (this->m_nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (uVar3 != 0) {
                uVar4 = 0;
                do {
                  pdVar2[uVar4] =
                       *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0xf0);
                  uVar4 = uVar4 + 1;
                } while (uVar3 != uVar4);
              }
              if (uVar3 < 3) {
                do {
                  pdVar2[uVar3] =
                       *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0xf0);
                  uVar3 = uVar3 + 1;
                } while (uVar3 != 3);
              }
              if (0x14 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
                pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + 0x12;
                uVar3 = 3;
                if ((((ulong)pdVar2 & 7) == 0) &&
                   (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
                  uVar3 = uVar4;
                }
                peVar1 = (this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                if (uVar3 != 0) {
                  uVar4 = 0;
                  do {
                    pdVar2[uVar4] =
                         *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x140);
                    uVar4 = uVar4 + 1;
                  } while (uVar3 != uVar4);
                }
                if (uVar3 < 3) {
                  do {
                    pdVar2[uVar3] =
                         *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x140);
                    uVar3 = uVar3 + 1;
                  } while (uVar3 != 3);
                }
                if (0x17 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows) {
                  pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data + 0x15;
                  uVar3 = 3;
                  if ((((ulong)pdVar2 & 7) == 0) &&
                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
                    uVar3 = uVar4;
                  }
                  peVar1 = (this->m_nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  if (uVar3 != 0) {
                    uVar4 = 0;
                    do {
                      pdVar2[uVar4] =
                           *(double *)((long)&peVar1->DDD_dt + uVar4 * 8 + 0xffffffffffffffe8);
                      uVar4 = uVar4 + 1;
                    } while (uVar3 != uVar4);
                  }
                  if (uVar3 < 3) {
                    do {
                      pdVar2[uVar3] =
                           *(double *)((long)&peVar1->DDD_dt + uVar3 * 8 + 0xffffffffffffffe8);
                      uVar3 = uVar3 + 1;
                    } while (uVar3 != 3);
                  }
                  if (0x1a < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_rows) {
                    pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data + 0x18;
                    uVar3 = 3;
                    if ((((ulong)pdVar2 & 7) == 0) &&
                       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3))
                    {
                      uVar3 = uVar4;
                    }
                    peVar1 = (this->m_nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    if (uVar3 != 0) {
                      uVar4 = 0;
                      do {
                        pdVar2[uVar4] =
                             *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x20);
                        uVar4 = uVar4 + 1;
                      } while (uVar3 != uVar4);
                    }
                    if (uVar3 < 3) {
                      do {
                        pdVar2[uVar3] =
                             *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x20);
                        uVar3 = uVar3 + 1;
                      } while (uVar3 != 3);
                    }
                    if (0x1d < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_rows) {
                      pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data + 0x1b;
                      uVar3 = 3;
                      if ((((ulong)pdVar2 & 7) == 0) &&
                         (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7), uVar4 < 3
                         )) {
                        uVar3 = uVar4;
                      }
                      peVar1 = (this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      if (uVar3 != 0) {
                        uVar4 = 0;
                        do {
                          pdVar2[uVar4] =
                               *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0xf0);
                          uVar4 = uVar4 + 1;
                        } while (uVar3 != uVar4);
                      }
                      if (uVar3 < 3) {
                        do {
                          pdVar2[uVar3] =
                               *(double *)((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0xf0);
                          uVar3 = uVar3 + 1;
                        } while (uVar3 != 3);
                      }
                      if (0x20 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 ).m_storage.m_rows) {
                        pdVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 ).m_storage.m_data + 0x1e;
                        uVar3 = 3;
                        if ((((ulong)pdVar2 & 7) == 0) &&
                           (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                           uVar4 < 3)) {
                          uVar3 = uVar4;
                        }
                        peVar1 = (this->m_nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].
                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        if (uVar3 != 0) {
                          uVar4 = 0;
                          do {
                            pdVar2[uVar4] =
                                 *(double *)
                                  ((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x140);
                            uVar4 = uVar4 + 1;
                          } while (uVar3 != uVar4);
                        }
                        if (uVar3 < 3) {
                          do {
                            pdVar2[uVar3] =
                                 *(double *)
                                  ((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x140);
                            uVar3 = uVar3 + 1;
                          } while (uVar3 != 3);
                        }
                        if (0x23 < (mD->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_rows) {
                          pdVar2 = (mD->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_data + 0x21;
                          uVar3 = 3;
                          if ((((ulong)pdVar2 & 7) == 0) &&
                             (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                             uVar4 < 3)) {
                            uVar3 = uVar4;
                          }
                          peVar1 = (this->m_nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2].
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                          if (uVar3 != 0) {
                            uVar4 = 0;
                            do {
                              pdVar2[uVar4] =
                                   *(double *)
                                    ((long)&peVar1->DDD_dt + uVar4 * 8 + 0xffffffffffffffe8);
                              uVar4 = uVar4 + 1;
                            } while (uVar3 != uVar4);
                          }
                          if (uVar3 < 3) {
                            do {
                              pdVar2[uVar3] =
                                   *(double *)
                                    ((long)&peVar1->DDD_dt + uVar3 * 8 + 0xffffffffffffffe8);
                              uVar3 = uVar3 + 1;
                            } while (uVar3 != 3);
                          }
                          if (0x26 < (mD->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_rows) {
                            pdVar2 = (mD->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_data + 0x24;
                            uVar3 = 3;
                            if ((((ulong)pdVar2 & 7) == 0) &&
                               (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                               uVar4 < 3)) {
                              uVar3 = uVar4;
                            }
                            peVar1 = (this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            if (uVar3 != 0) {
                              uVar4 = 0;
                              do {
                                pdVar2[uVar4] =
                                     *(double *)
                                      ((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x20);
                                uVar4 = uVar4 + 1;
                              } while (uVar3 != uVar4);
                            }
                            if (uVar3 < 3) {
                              do {
                                pdVar2[uVar3] =
                                     *(double *)
                                      ((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x20);
                                uVar3 = uVar3 + 1;
                              } while (uVar3 != 3);
                            }
                            if (0x29 < (mD->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_rows) {
                              pdVar2 = (mD->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data + 0x27;
                              uVar3 = 3;
                              if ((((ulong)pdVar2 & 7) == 0) &&
                                 (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                                 uVar4 < 3)) {
                                uVar3 = uVar4;
                              }
                              peVar1 = (this->m_nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[3].
                                       super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              if (uVar3 != 0) {
                                uVar4 = 0;
                                do {
                                  pdVar2[uVar4] =
                                       *(double *)
                                        ((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0xf0);
                                  uVar4 = uVar4 + 1;
                                } while (uVar3 != uVar4);
                              }
                              if (uVar3 < 3) {
                                do {
                                  pdVar2[uVar3] =
                                       *(double *)
                                        ((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0xf0);
                                  uVar3 = uVar3 + 1;
                                } while (uVar3 != 3);
                              }
                              if (0x2c < (mD->
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         ).m_storage.m_rows) {
                                pdVar2 = (mD->
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         ).m_storage.m_data + 0x2a;
                                uVar3 = 3;
                                if ((((ulong)pdVar2 & 7) == 0) &&
                                   (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7),
                                   uVar4 < 3)) {
                                  uVar3 = uVar4;
                                }
                                peVar1 = (this->m_nodes).
                                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[3].
                                         super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                if (uVar3 != 0) {
                                  uVar4 = 0;
                                  do {
                                    pdVar2[uVar4] =
                                         *(double *)
                                          ((long)&peVar1->super_ChNodeFEAxyzDD + uVar4 * 8 + 0x140);
                                    uVar4 = uVar4 + 1;
                                  } while (uVar3 != uVar4);
                                }
                                if (uVar3 < 3) {
                                  do {
                                    pdVar2[uVar3] =
                                         *(double *)
                                          ((long)&peVar1->super_ChNodeFEAxyzDD + uVar3 * 8 + 0x140);
                                    uVar3 = uVar3 + 1;
                                  } while (uVar3 != 3);
                                }
                                if (0x2f < (mD->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           ).m_storage.m_rows) {
                                  pdVar2 = (mD->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           ).m_storage.m_data + 0x2d;
                                  uVar3 = 3;
                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7
                                                     ), uVar4 < 3)) {
                                    uVar3 = uVar4;
                                  }
                                  peVar1 = (this->m_nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[3].
                                           super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                                  if (uVar3 != 0) {
                                    uVar4 = 0;
                                    do {
                                      pdVar2[uVar4] =
                                           *(double *)
                                            ((long)&peVar1->DDD_dt + uVar4 * 8 + 0xffffffffffffffe8)
                                      ;
                                      uVar4 = uVar4 + 1;
                                    } while (uVar3 != uVar4);
                                  }
                                  if (uVar3 < 3) {
                                    do {
                                      pdVar2[uVar3] =
                                           *(double *)
                                            ((long)&peVar1->DDD_dt + uVar3 * 8 + 0xffffffffffffffe8)
                                      ;
                                      uVar3 = uVar3 + 1;
                                    } while (uVar3 != 3);
                                  }
                                  if (0x32 < (mD->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             ).m_storage.m_rows) {
                                    pdVar2 = (mD->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                             ).m_storage.m_data + 0x30;
                                    uVar3 = 3;
                                    if ((((ulong)pdVar2 & 7) == 0) &&
                                       (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) &
                                                       7), uVar4 < 3)) {
                                      uVar3 = uVar4;
                                    }
                                    peVar1 = (this->m_nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[4].
                                             super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr;
                                    if (uVar3 != 0) {
                                      uVar4 = 0;
                                      do {
                                        pdVar2[uVar4] =
                                             *(double *)
                                              ((long)&peVar1->super_ChNodeFEAxyzDD +
                                              uVar4 * 8 + 0x20);
                                        uVar4 = uVar4 + 1;
                                      } while (uVar3 != uVar4);
                                    }
                                    if (uVar3 < 3) {
                                      do {
                                        pdVar2[uVar3] =
                                             *(double *)
                                              ((long)&peVar1->super_ChNodeFEAxyzDD +
                                              uVar3 * 8 + 0x20);
                                        uVar3 = uVar3 + 1;
                                      } while (uVar3 != 3);
                                    }
                                    if (0x35 < (mD->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               ).m_storage.m_rows) {
                                      pdVar2 = (mD->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               ).m_storage.m_data + 0x33;
                                      uVar3 = 3;
                                      if ((((ulong)pdVar2 & 7) == 0) &&
                                         (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) & 0x1fffffff)
                                                         & 7), uVar4 < 3)) {
                                        uVar3 = uVar4;
                                      }
                                      peVar1 = (this->m_nodes).
                                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[4].
                                               super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr;
                                      if (uVar3 != 0) {
                                        uVar4 = 0;
                                        do {
                                          pdVar2[uVar4] =
                                               *(double *)
                                                ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                uVar4 * 8 + 0xf0);
                                          uVar4 = uVar4 + 1;
                                        } while (uVar3 != uVar4);
                                      }
                                      if (uVar3 < 3) {
                                        do {
                                          pdVar2[uVar3] =
                                               *(double *)
                                                ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                uVar3 * 8 + 0xf0);
                                          uVar3 = uVar3 + 1;
                                        } while (uVar3 != 3);
                                      }
                                      if (0x38 < (mD->
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 ).m_storage.m_rows) {
                                        pdVar2 = (mD->
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 ).m_storage.m_data + 0x36;
                                        uVar3 = 3;
                                        if ((((ulong)pdVar2 & 7) == 0) &&
                                           (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                             0x1fffffff) & 7), uVar4 < 3)) {
                                          uVar3 = uVar4;
                                        }
                                        peVar1 = (this->m_nodes).
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[4].
                                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr;
                                        if (uVar3 != 0) {
                                          uVar4 = 0;
                                          do {
                                            pdVar2[uVar4] =
                                                 *(double *)
                                                  ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                  uVar4 * 8 + 0x140);
                                            uVar4 = uVar4 + 1;
                                          } while (uVar3 != uVar4);
                                        }
                                        if (uVar3 < 3) {
                                          do {
                                            pdVar2[uVar3] =
                                                 *(double *)
                                                  ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                  uVar3 * 8 + 0x140);
                                            uVar3 = uVar3 + 1;
                                          } while (uVar3 != 3);
                                        }
                                        if (0x3b < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                          pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x39;
                                          uVar3 = 3;
                                          if ((((ulong)pdVar2 & 7) == 0) &&
                                             (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                               0x1fffffff) & 7), uVar4 < 3)) {
                                            uVar3 = uVar4;
                                          }
                                          peVar1 = (this->m_nodes).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                          if (uVar3 != 0) {
                                            uVar4 = 0;
                                            do {
                                              pdVar2[uVar4] =
                                                   *(double *)
                                                    ((long)&peVar1->DDD_dt +
                                                    uVar4 * 8 + 0xffffffffffffffe8);
                                              uVar4 = uVar4 + 1;
                                            } while (uVar3 != uVar4);
                                          }
                                          if (uVar3 < 3) {
                                            do {
                                              pdVar2[uVar3] =
                                                   *(double *)
                                                    ((long)&peVar1->DDD_dt +
                                                    uVar3 * 8 + 0xffffffffffffffe8);
                                              uVar3 = uVar3 + 1;
                                            } while (uVar3 != 3);
                                          }
                                          if (0x3e < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                            pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x3c;
                                            uVar3 = 3;
                                            if ((((ulong)pdVar2 & 7) == 0) &&
                                               (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                 0x1fffffff) & 7), uVar4 < 3)) {
                                              uVar3 = uVar4;
                                            }
                                            peVar1 = (this->m_nodes).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                            if (uVar3 != 0) {
                                              uVar4 = 0;
                                              do {
                                                pdVar2[uVar4] =
                                                     *(double *)
                                                      ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                      uVar4 * 8 + 0x20);
                                                uVar4 = uVar4 + 1;
                                              } while (uVar3 != uVar4);
                                            }
                                            if (uVar3 < 3) {
                                              do {
                                                pdVar2[uVar3] =
                                                     *(double *)
                                                      ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                      uVar3 * 8 + 0x20);
                                                uVar3 = uVar3 + 1;
                                              } while (uVar3 != 3);
                                            }
                                            if (0x41 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                              pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x3f;
                                              uVar3 = 3;
                                              if ((((ulong)pdVar2 & 7) == 0) &&
                                                 (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                   0x1fffffff) & 7), uVar4 < 3)) {
                                                uVar3 = uVar4;
                                              }
                                              peVar1 = (this->m_nodes).
                                                                                                              
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                              if (uVar3 != 0) {
                                                uVar4 = 0;
                                                do {
                                                  pdVar2[uVar4] =
                                                       *(double *)
                                                        ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                        uVar4 * 8 + 0xf0);
                                                  uVar4 = uVar4 + 1;
                                                } while (uVar3 != uVar4);
                                              }
                                              if (uVar3 < 3) {
                                                do {
                                                  pdVar2[uVar3] =
                                                       *(double *)
                                                        ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                        uVar3 * 8 + 0xf0);
                                                  uVar3 = uVar3 + 1;
                                                } while (uVar3 != 3);
                                              }
                                              if (0x44 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x42;
                                                uVar3 = 3;
                                                if ((((ulong)pdVar2 & 7) == 0) &&
                                                   (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                     0x1fffffff) & 7), uVar4 < 3)) {
                                                  uVar3 = uVar4;
                                                }
                                                peVar1 = (this->m_nodes).
                                                                                                                  
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                if (uVar3 != 0) {
                                                  uVar4 = 0;
                                                  do {
                                                    pdVar2[uVar4] =
                                                         *(double *)
                                                          ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                          uVar4 * 8 + 0x140);
                                                    uVar4 = uVar4 + 1;
                                                  } while (uVar3 != uVar4);
                                                }
                                                if (uVar3 < 3) {
                                                  do {
                                                    pdVar2[uVar3] =
                                                         *(double *)
                                                          ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                          uVar3 * 8 + 0x140);
                                                    uVar3 = uVar3 + 1;
                                                  } while (uVar3 != 3);
                                                }
                                                if (0x47 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                  pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x45;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->DDD_dt +
                                                            uVar4 * 8 + 0xffffffffffffffe8);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->DDD_dt +
                                                            uVar3 * 8 + 0xffffffffffffffe8);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x4a < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x48;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar4 * 8 + 0x20);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar3 * 8 + 0x20);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x4d < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x4b;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar4 * 8 + 0xf0);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar3 * 8 + 0xf0);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x50 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x4e;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar4 * 8 + 0x140);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar3 * 8 + 0x140);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x53 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x51;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->DDD_dt +
                                                            uVar4 * 8 + 0xffffffffffffffe8);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->DDD_dt +
                                                            uVar3 * 8 + 0xffffffffffffffe8);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x56 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x54;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar4 * 8 + 0x20);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar3 * 8 + 0x20);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x59 < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x57;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar4 * 8 + 0xf0);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar3 * 8 + 0xf0);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x5c < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x5a;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar4 * 8 + 0x140);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->super_ChNodeFEAxyzDD +
                                                            uVar3 * 8 + 0x140);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  if (0x5f < (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows) {
                                                    pdVar2 = (mD->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + 0x5d;
                                                  uVar3 = 3;
                                                  if ((((ulong)pdVar2 & 7) == 0) &&
                                                     (uVar4 = (ulong)(-((uint)((ulong)pdVar2 >> 3) &
                                                                       0x1fffffff) & 7), uVar4 < 3))
                                                  {
                                                    uVar3 = uVar4;
                                                  }
                                                  peVar1 = (this->m_nodes).
                                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  if (uVar3 != 0) {
                                                    uVar4 = 0;
                                                    do {
                                                      pdVar2[uVar4] =
                                                           *(double *)
                                                            ((long)&peVar1->DDD_dt +
                                                            uVar4 * 8 + 0xffffffffffffffe8);
                                                      uVar4 = uVar4 + 1;
                                                    } while (uVar3 != uVar4);
                                                  }
                                                  if (uVar3 < 3) {
                                                    do {
                                                      pdVar2[uVar3] =
                                                           *(double *)
                                                            ((long)&peVar1->DDD_dt +
                                                            uVar3 * 8 + 0xffffffffffffffe8);
                                                      uVar3 = uVar3 + 1;
                                                    } while (uVar3 != 3);
                                                  }
                                                  return;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementHexaANCF_3843::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(6, 3) = m_nodes[0]->GetDD().eigen();
    mD.segment(9, 3) = m_nodes[0]->GetDDD().eigen();

    mD.segment(12, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(15, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(18, 3) = m_nodes[1]->GetDD().eigen();
    mD.segment(21, 3) = m_nodes[1]->GetDDD().eigen();

    mD.segment(24, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(27, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(30, 3) = m_nodes[2]->GetDD().eigen();
    mD.segment(33, 3) = m_nodes[2]->GetDDD().eigen();

    mD.segment(36, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(39, 3) = m_nodes[3]->GetD().eigen();
    mD.segment(42, 3) = m_nodes[3]->GetDD().eigen();
    mD.segment(45, 3) = m_nodes[3]->GetDDD().eigen();

    mD.segment(48, 3) = m_nodes[4]->GetPos().eigen();
    mD.segment(51, 3) = m_nodes[4]->GetD().eigen();
    mD.segment(54, 3) = m_nodes[4]->GetDD().eigen();
    mD.segment(57, 3) = m_nodes[4]->GetDDD().eigen();

    mD.segment(60, 3) = m_nodes[5]->GetPos().eigen();
    mD.segment(63, 3) = m_nodes[5]->GetD().eigen();
    mD.segment(66, 3) = m_nodes[5]->GetDD().eigen();
    mD.segment(69, 3) = m_nodes[5]->GetDDD().eigen();

    mD.segment(72, 3) = m_nodes[6]->GetPos().eigen();
    mD.segment(75, 3) = m_nodes[6]->GetD().eigen();
    mD.segment(78, 3) = m_nodes[6]->GetDD().eigen();
    mD.segment(81, 3) = m_nodes[6]->GetDDD().eigen();

    mD.segment(84, 3) = m_nodes[7]->GetPos().eigen();
    mD.segment(87, 3) = m_nodes[7]->GetD().eigen();
    mD.segment(90, 3) = m_nodes[7]->GetDD().eigen();
    mD.segment(93, 3) = m_nodes[7]->GetDDD().eigen();
}